

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

uint32_t __thiscall
google::protobuf::Reflection::GetOneofCase
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  OneofDescriptor *message_00;
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  uint *puVar3;
  LogMessage local_38;
  Voidify local_21;
  OneofDescriptor *local_20;
  OneofDescriptor *oneof_descriptor_local;
  Message *message_local;
  Reflection *this_local;
  
  local_20 = oneof_descriptor;
  oneof_descriptor_local = (OneofDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  message_00 = oneof_descriptor_local;
  if (!bVar1) {
    offset = internal::ReflectionSchema::GetOneofCaseOffset(&this->schema_,local_20);
    puVar3 = internal::GetConstRefAtOffset<unsigned_int>((Message *)message_00,offset);
    return *puVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xb9c,"!oneof_descriptor->is_synthetic()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

uint32_t Reflection::GetOneofCase(
    const Message& message, const OneofDescriptor* oneof_descriptor) const {
  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  return internal::GetConstRefAtOffset<uint32_t>(
      message, schema_.GetOneofCaseOffset(oneof_descriptor));
}